

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  long lVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  RTCRayQueryContext *pRVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined4 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  undefined1 auVar69 [16];
  undefined8 uVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar88 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong *local_27e8;
  long local_2798;
  int local_278c;
  RTCFilterFunctionNArguments local_2788;
  long local_2758;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar36 [16];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27e8 = local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar7 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    auVar34 = vandps_avx512vl((undefined1  [16])aVar2,auVar34);
    auVar35._8_4_ = 0x219392ef;
    auVar35._0_8_ = 0x219392ef219392ef;
    auVar35._12_4_ = 0x219392ef;
    uVar28 = vcmpps_avx512vl(auVar34,auVar35,1);
    local_2398[0] = 0;
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar34 = vdivps_avx(auVar69,(undefined1  [16])aVar2);
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar6 = (bool)((byte)uVar28 & 1);
    auVar36._0_4_ = (uint)bVar6 * auVar35._0_4_ | (uint)!bVar6 * auVar34._0_4_;
    bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
    auVar36._4_4_ = (uint)bVar6 * auVar35._4_4_ | (uint)!bVar6 * auVar34._4_4_;
    bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
    auVar36._8_4_ = (uint)bVar6 * auVar35._8_4_ | (uint)!bVar6 * auVar34._8_4_;
    bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar36._12_4_ = (uint)bVar6 * auVar35._12_4_ | (uint)!bVar6 * auVar34._12_4_;
    auVar37._8_4_ = 0x3f7ffffa;
    auVar37._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar37._12_4_ = 0x3f7ffffa;
    auVar37 = vmulps_avx512vl(auVar36,auVar37);
    auVar38._8_4_ = 0x3f800003;
    auVar38._0_8_ = 0x3f8000033f800003;
    auVar38._12_4_ = 0x3f800003;
    auVar38 = vmulps_avx512vl(auVar36,auVar38);
    uVar65 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_25a0._4_4_ = uVar65;
    local_25a0._0_4_ = uVar65;
    local_25a0._8_4_ = uVar65;
    local_25a0._12_4_ = uVar65;
    local_25a0._16_4_ = uVar65;
    local_25a0._20_4_ = uVar65;
    local_25a0._24_4_ = uVar65;
    local_25a0._28_4_ = uVar65;
    auVar74 = ZEXT3264(local_25a0);
    uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_25c0._4_4_ = uVar65;
    local_25c0._0_4_ = uVar65;
    local_25c0._8_4_ = uVar65;
    local_25c0._12_4_ = uVar65;
    local_25c0._16_4_ = uVar65;
    local_25c0._20_4_ = uVar65;
    local_25c0._24_4_ = uVar65;
    local_25c0._28_4_ = uVar65;
    auVar76 = ZEXT3264(local_25c0);
    uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_25e0._4_4_ = uVar65;
    local_25e0._0_4_ = uVar65;
    local_25e0._8_4_ = uVar65;
    local_25e0._12_4_ = uVar65;
    local_25e0._16_4_ = uVar65;
    local_25e0._20_4_ = uVar65;
    local_25e0._24_4_ = uVar65;
    local_25e0._28_4_ = uVar65;
    auVar77 = ZEXT3264(local_25e0);
    fVar68 = auVar37._0_4_;
    auVar34 = vmovshdup_avx(auVar37);
    uVar70 = auVar34._0_8_;
    local_2620._8_8_ = uVar70;
    local_2620._0_8_ = uVar70;
    local_2620._16_8_ = uVar70;
    local_2620._24_8_ = uVar70;
    auVar84 = ZEXT3264(local_2620);
    auVar40._8_4_ = 2;
    auVar40._0_8_ = 0x200000002;
    auVar40._12_4_ = 2;
    auVar40._16_4_ = 2;
    auVar40._20_4_ = 2;
    auVar40._24_4_ = 2;
    auVar40._28_4_ = 2;
    auVar35 = vshufpd_avx(auVar37,auVar37,1);
    local_2640 = vpermps_avx2(auVar40,ZEXT1632(auVar37));
    auVar87 = ZEXT3264(local_2640);
    fVar62 = auVar38._0_4_;
    auVar39._8_4_ = 1;
    auVar39._0_8_ = 0x100000001;
    auVar39._12_4_ = 1;
    auVar39._16_4_ = 1;
    auVar39._20_4_ = 1;
    auVar39._24_4_ = 1;
    auVar39._28_4_ = 1;
    local_2680 = vpermps_avx512vl(auVar39,ZEXT1632(auVar38));
    auVar95 = ZEXT3264(local_2680);
    local_26a0 = vpermps_avx512vl(auVar40,ZEXT1632(auVar38));
    auVar96 = ZEXT3264(local_26a0);
    uVar30 = (ulong)(fVar68 < 0.0) * 0x20;
    uVar31 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x40;
    uVar28 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x80;
    local_26c0 = vbroadcastss_avx512vl(auVar7);
    auVar97 = ZEXT3264(local_26c0);
    uVar65 = auVar8._0_4_;
    auVar64 = ZEXT3264(CONCAT428(uVar65,CONCAT424(uVar65,CONCAT420(uVar65,CONCAT416(uVar65,CONCAT412
                                                  (uVar65,CONCAT48(uVar65,CONCAT44(uVar65,uVar65))))
                                                  ))));
    auVar98 = ZEXT3264(_DAT_01fe9900);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
    auVar99 = ZEXT3264(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar100 = ZEXT3264(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar101 = ZEXT3264(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar102 = ZEXT3264(auVar39);
    local_2600 = fVar68;
    fStack_25fc = fVar68;
    fStack_25f8 = fVar68;
    fStack_25f4 = fVar68;
    fStack_25f0 = fVar68;
    fStack_25ec = fVar68;
    fStack_25e8 = fVar68;
    fStack_25e4 = fVar68;
    local_2660 = fVar62;
    fStack_265c = fVar62;
    fStack_2658 = fVar62;
    fStack_2654 = fVar62;
    fStack_2650 = fVar62;
    fStack_264c = fVar62;
    fStack_2648 = fVar62;
    fStack_2644 = fVar62;
    fVar78 = fVar68;
    fVar79 = fVar68;
    fVar80 = fVar68;
    fVar81 = fVar68;
    fVar82 = fVar68;
    fVar83 = fVar68;
    fVar89 = fVar62;
    fVar90 = fVar62;
    fVar91 = fVar62;
    fVar92 = fVar62;
    fVar93 = fVar62;
    fVar94 = fVar62;
    do {
      pfVar1 = (float *)(local_27e8 + -1);
      local_27e8 = local_27e8 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar32 = *local_27e8;
        while ((uVar32 & 8) == 0) {
          auVar48 = auVar74._0_32_;
          auVar39 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar30),auVar48);
          auVar41._4_4_ = fVar78 * auVar39._4_4_;
          auVar41._0_4_ = fVar68 * auVar39._0_4_;
          auVar41._8_4_ = fVar79 * auVar39._8_4_;
          auVar41._12_4_ = fVar80 * auVar39._12_4_;
          auVar41._16_4_ = fVar81 * auVar39._16_4_;
          auVar41._20_4_ = fVar82 * auVar39._20_4_;
          auVar41._24_4_ = fVar83 * auVar39._24_4_;
          auVar41._28_4_ = auVar39._28_4_;
          auVar58 = auVar76._0_32_;
          auVar39 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar31),auVar58);
          auVar44._4_4_ = auVar84._4_4_ * auVar39._4_4_;
          auVar44._0_4_ = auVar84._0_4_ * auVar39._0_4_;
          auVar44._8_4_ = auVar84._8_4_ * auVar39._8_4_;
          auVar44._12_4_ = auVar84._12_4_ * auVar39._12_4_;
          auVar44._16_4_ = auVar84._16_4_ * auVar39._16_4_;
          auVar44._20_4_ = auVar84._20_4_ * auVar39._20_4_;
          auVar44._24_4_ = auVar84._24_4_ * auVar39._24_4_;
          auVar44._28_4_ = auVar39._28_4_;
          auVar39 = vmaxps_avx(auVar41,auVar44);
          auVar44 = auVar77._0_32_;
          auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar28),auVar44);
          auVar42._4_4_ = auVar87._4_4_ * auVar40._4_4_;
          auVar42._0_4_ = auVar87._0_4_ * auVar40._0_4_;
          auVar42._8_4_ = auVar87._8_4_ * auVar40._8_4_;
          auVar42._12_4_ = auVar87._12_4_ * auVar40._12_4_;
          auVar42._16_4_ = auVar87._16_4_ * auVar40._16_4_;
          auVar42._20_4_ = auVar87._20_4_ * auVar40._20_4_;
          auVar42._24_4_ = auVar87._24_4_ * auVar40._24_4_;
          auVar42._28_4_ = auVar40._28_4_;
          auVar40 = vmaxps_avx512vl(auVar42,auVar97._0_32_);
          auVar39 = vmaxps_avx(auVar39,auVar40);
          auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar30 ^ 0x20)),auVar48);
          auVar43._4_4_ = fVar89 * auVar40._4_4_;
          auVar43._0_4_ = fVar62 * auVar40._0_4_;
          auVar43._8_4_ = fVar90 * auVar40._8_4_;
          auVar43._12_4_ = fVar91 * auVar40._12_4_;
          auVar43._16_4_ = fVar92 * auVar40._16_4_;
          auVar43._20_4_ = fVar93 * auVar40._20_4_;
          auVar43._24_4_ = fVar94 * auVar40._24_4_;
          auVar43._28_4_ = auVar40._28_4_;
          auVar40 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar31 ^ 0x20)),auVar58);
          auVar40 = vmulps_avx512vl(auVar95._0_32_,auVar40);
          auVar40 = vminps_avx(auVar43,auVar40);
          auVar41 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar28 ^ 0x20)),auVar44);
          auVar41 = vmulps_avx512vl(auVar96._0_32_,auVar41);
          auVar41 = vminps_avx(auVar41,auVar64._0_32_);
          auVar40 = vminps_avx(auVar40,auVar41);
          uVar29 = vcmpps_avx512vl(auVar39,auVar40,2);
          bVar21 = (byte)uVar29;
          if (bVar21 == 0) goto LAB_01f26b8d;
          auVar40 = *(undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0);
          auVar41 = ((undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0))[1];
          auVar42 = vpternlogd_avx512vl(auVar98._0_32_,auVar39,auVar99._0_32_,0xf8);
          auVar43 = vpcompressd_avx512vl(auVar42);
          auVar46._0_4_ =
               (uint)(bVar21 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar42._0_4_;
          bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar46._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
          bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar46._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
          bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
          auVar46._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
          bVar6 = (bool)((byte)(uVar29 >> 4) & 1);
          auVar46._16_4_ = (uint)bVar6 * auVar43._16_4_ | (uint)!bVar6 * auVar42._16_4_;
          bVar6 = (bool)((byte)(uVar29 >> 5) & 1);
          auVar46._20_4_ = (uint)bVar6 * auVar43._20_4_ | (uint)!bVar6 * auVar42._20_4_;
          bVar6 = (bool)((byte)(uVar29 >> 6) & 1);
          auVar46._24_4_ = (uint)bVar6 * auVar43._24_4_ | (uint)!bVar6 * auVar42._24_4_;
          bVar6 = SUB81(uVar29 >> 7,0);
          auVar46._28_4_ = (uint)bVar6 * auVar43._28_4_ | (uint)!bVar6 * auVar42._28_4_;
          auVar42 = vpermt2q_avx512vl(auVar40,auVar46,auVar41);
          uVar32 = auVar42._0_8_;
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 != 0) {
            auVar42 = vpshufd_avx2(auVar46,0x55);
            vpermt2q_avx512vl(auVar40,auVar42,auVar41);
            auVar43 = vpminsd_avx2(auVar46,auVar42);
            auVar42 = vpmaxsd_avx2(auVar46,auVar42);
            bVar21 = bVar21 - 1 & bVar21;
            if (bVar21 == 0) {
              auVar44 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
              uVar32 = auVar44._0_8_;
              auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
              *local_27e8 = auVar40._0_8_;
              auVar39 = vpermd_avx2(auVar42,auVar39);
              *(int *)(local_27e8 + 1) = auVar39._0_4_;
              local_27e8 = local_27e8 + 2;
            }
            else {
              auVar49 = vpshufd_avx2(auVar46,0xaa);
              vpermt2q_avx512vl(auVar40,auVar49,auVar41);
              auVar47 = vpminsd_avx2(auVar43,auVar49);
              auVar43 = vpmaxsd_avx2(auVar43,auVar49);
              auVar49 = vpminsd_avx2(auVar42,auVar43);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              bVar21 = bVar21 - 1 & bVar21;
              if (bVar21 == 0) {
                auVar44 = vpermi2q_avx512vl(auVar47,auVar40,auVar41);
                uVar32 = auVar44._0_8_;
                auVar44 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                *local_27e8 = auVar44._0_8_;
                auVar44 = vpermd_avx2(auVar42,auVar39);
                *(int *)(local_27e8 + 1) = auVar44._0_4_;
                auVar40 = vpermt2q_avx512vl(auVar40,auVar49,auVar41);
                local_27e8[2] = auVar40._0_8_;
                auVar39 = vpermd_avx2(auVar49,auVar39);
                *(int *)(local_27e8 + 3) = auVar39._0_4_;
                local_27e8 = local_27e8 + 4;
              }
              else {
                auVar43 = vpshufd_avx2(auVar46,0xff);
                vpermt2q_avx512vl(auVar40,auVar43,auVar41);
                auVar57 = vpminsd_avx2(auVar47,auVar43);
                auVar43 = vpmaxsd_avx2(auVar47,auVar43);
                auVar47 = vpminsd_avx2(auVar49,auVar43);
                auVar43 = vpmaxsd_avx2(auVar49,auVar43);
                auVar49 = vpminsd_avx2(auVar42,auVar43);
                auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                bVar21 = bVar21 - 1 & bVar21;
                if (bVar21 == 0) {
                  auVar43 = vpermi2q_avx512vl(auVar57,auVar40,auVar41);
                  uVar32 = auVar43._0_8_;
                  auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                  *local_27e8 = auVar43._0_8_;
                  auVar42 = vpermd_avx2(auVar42,auVar39);
                  *(int *)(local_27e8 + 1) = auVar42._0_4_;
                  auVar42 = vpermt2q_avx512vl(auVar40,auVar49,auVar41);
                  local_27e8[2] = auVar42._0_8_;
                  auVar42 = vpermd_avx2(auVar49,auVar39);
                  *(int *)(local_27e8 + 3) = auVar42._0_4_;
                  auVar40 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                  local_27e8[4] = auVar40._0_8_;
                  auVar39 = vpermd_avx2(auVar47,auVar39);
                  *(int *)(local_27e8 + 5) = auVar39._0_4_;
                  local_27e8 = local_27e8 + 6;
                }
                else {
                  auVar45 = valignd_avx512vl(auVar46,auVar46,3);
                  auVar43 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar46 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar43,auVar57);
                  auVar43 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar46 = vpermt2d_avx512vl(auVar46,auVar43,auVar47);
                  auVar46 = vpermt2d_avx512vl(auVar46,auVar43,auVar49);
                  auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar42 = vpermt2d_avx512vl(auVar46,auVar43,auVar42);
                  auVar74 = ZEXT3264(auVar42);
                  bVar24 = bVar21;
                  do {
                    auVar43 = auVar74._0_32_;
                    auVar49._8_4_ = 1;
                    auVar49._0_8_ = 0x100000001;
                    auVar49._12_4_ = 1;
                    auVar49._16_4_ = 1;
                    auVar49._20_4_ = 1;
                    auVar49._24_4_ = 1;
                    auVar49._28_4_ = 1;
                    auVar42 = vpermd_avx2(auVar49,auVar45);
                    auVar45 = valignd_avx512vl(auVar45,auVar45,1);
                    vpermt2q_avx512vl(auVar40,auVar45,auVar41);
                    bVar24 = bVar24 - 1 & bVar24;
                    uVar70 = vpcmpd_avx512vl(auVar42,auVar43,5);
                    auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                    bVar13 = (byte)uVar70 << 1;
                    auVar43 = valignd_avx512vl(auVar43,auVar43,7);
                    bVar6 = (bool)((byte)uVar70 & 1);
                    auVar47._4_4_ = (uint)bVar6 * auVar43._4_4_ | (uint)!bVar6 * auVar42._4_4_;
                    auVar47._0_4_ = auVar42._0_4_;
                    bVar6 = (bool)(bVar13 >> 2 & 1);
                    auVar47._8_4_ = (uint)bVar6 * auVar43._8_4_ | (uint)!bVar6 * auVar42._8_4_;
                    bVar6 = (bool)(bVar13 >> 3 & 1);
                    auVar47._12_4_ = (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * auVar42._12_4_;
                    bVar6 = (bool)(bVar13 >> 4 & 1);
                    auVar47._16_4_ = (uint)bVar6 * auVar43._16_4_ | (uint)!bVar6 * auVar42._16_4_;
                    bVar6 = (bool)(bVar13 >> 5 & 1);
                    auVar47._20_4_ = (uint)bVar6 * auVar43._20_4_ | (uint)!bVar6 * auVar42._20_4_;
                    bVar6 = (bool)(bVar13 >> 6 & 1);
                    auVar47._24_4_ = (uint)bVar6 * auVar43._24_4_ | (uint)!bVar6 * auVar42._24_4_;
                    auVar47._28_4_ =
                         (uint)(bVar13 >> 7) * auVar43._28_4_ |
                         (uint)!(bool)(bVar13 >> 7) * auVar42._28_4_;
                    auVar74 = ZEXT3264(auVar47);
                  } while (bVar24 != 0);
                  lVar22 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
                  do {
                    auVar42 = vpermi2q_avx512vl(auVar47,auVar40,auVar41);
                    *local_27e8 = auVar42._0_8_;
                    auVar43 = auVar74._0_32_;
                    auVar42 = vpermd_avx2(auVar43,auVar39);
                    *(int *)(local_27e8 + 1) = auVar42._0_4_;
                    auVar47 = valignd_avx512vl(auVar43,auVar43,1);
                    local_27e8 = local_27e8 + 2;
                    auVar74 = ZEXT3264(auVar47);
                    lVar22 = lVar22 + -1;
                  } while (lVar22 != 0);
                  auVar39 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                  uVar32 = auVar39._0_8_;
                }
                auVar74 = ZEXT3264(auVar48);
                auVar76 = ZEXT3264(auVar58);
                auVar77 = ZEXT3264(auVar44);
                auVar84 = ZEXT3264(auVar84._0_32_);
                auVar87 = ZEXT3264(auVar87._0_32_);
                auVar95 = ZEXT3264(auVar95._0_32_);
                auVar96 = ZEXT3264(auVar96._0_32_);
                auVar97 = ZEXT3264(auVar97._0_32_);
                auVar98 = ZEXT3264(auVar98._0_32_);
                auVar99 = ZEXT3264(auVar99._0_32_);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar100 = ZEXT3264(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT3264(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar102 = ZEXT3264(auVar39);
              }
            }
          }
        }
        local_2758 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_2758 != 0) {
          uVar32 = uVar32 & 0xfffffffffffffff0;
          local_2798 = 0;
          do {
            lVar23 = local_2798 * 0xe0;
            lVar22 = uVar32 + 0xd0 + lVar23;
            local_26e0 = *(undefined8 *)(lVar22 + 0x10);
            uStack_26d8 = *(undefined8 *)(lVar22 + 0x18);
            lVar22 = uVar32 + 0xc0 + lVar23;
            local_2580 = *(undefined8 *)(lVar22 + 0x10);
            uStack_2578 = *(undefined8 *)(lVar22 + 0x18);
            uStack_2570 = local_2580;
            uStack_2568 = uStack_2578;
            uStack_26d0 = local_26e0;
            uStack_26c8 = uStack_26d8;
            auVar50._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x60 + lVar23);
            auVar50._0_16_ = *(undefined1 (*) [16])(uVar32 + lVar23);
            auVar51._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x70 + lVar23);
            auVar51._0_16_ = *(undefined1 (*) [16])(uVar32 + 0x10 + lVar23);
            auVar52._16_16_ = *(undefined1 (*) [16])(uVar32 + 0x80 + lVar23);
            auVar52._0_16_ = *(undefined1 (*) [16])(uVar32 + 0x20 + lVar23);
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0x30 + lVar23);
            auVar53._16_16_ = auVar34;
            auVar53._0_16_ = auVar34;
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0x40 + lVar23);
            auVar54._16_16_ = auVar34;
            auVar54._0_16_ = auVar34;
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0x50 + lVar23);
            auVar55._16_16_ = auVar34;
            auVar55._0_16_ = auVar34;
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0x90 + lVar23);
            auVar56._16_16_ = auVar34;
            auVar56._0_16_ = auVar34;
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0xa0 + lVar23);
            auVar60._16_16_ = auVar34;
            auVar60._0_16_ = auVar34;
            auVar34 = *(undefined1 (*) [16])(uVar32 + 0xb0 + lVar23);
            auVar85._16_16_ = auVar34;
            auVar85._0_16_ = auVar34;
            uVar65 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar88._4_4_ = uVar65;
            auVar88._0_4_ = uVar65;
            auVar88._8_4_ = uVar65;
            auVar88._12_4_ = uVar65;
            auVar88._16_4_ = uVar65;
            auVar88._20_4_ = uVar65;
            auVar88._24_4_ = uVar65;
            auVar88._28_4_ = uVar65;
            auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar65 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar71._4_4_ = uVar65;
            auVar71._0_4_ = uVar65;
            auVar71._8_4_ = uVar65;
            auVar71._12_4_ = uVar65;
            auVar71._16_4_ = uVar65;
            auVar71._20_4_ = uVar65;
            auVar71._24_4_ = uVar65;
            auVar71._28_4_ = uVar65;
            uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar72._4_4_ = uVar65;
            auVar72._0_4_ = uVar65;
            auVar72._8_4_ = uVar65;
            auVar72._12_4_ = uVar65;
            auVar72._16_4_ = uVar65;
            auVar72._20_4_ = uVar65;
            auVar72._24_4_ = uVar65;
            auVar72._28_4_ = uVar65;
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar75._4_4_ = fVar68;
            auVar75._0_4_ = fVar68;
            auVar75._8_4_ = fVar68;
            auVar75._12_4_ = fVar68;
            auVar75._16_4_ = fVar68;
            auVar75._20_4_ = fVar68;
            auVar75._24_4_ = fVar68;
            auVar75._28_4_ = fVar68;
            auVar39 = vsubps_avx(auVar50,auVar88);
            auVar42 = vsubps_avx512vl(auVar51,auVar41);
            auVar43 = vsubps_avx512vl(auVar52,auVar44);
            auVar48 = vsubps_avx512vl(auVar53,auVar88);
            auVar46 = vsubps_avx512vl(auVar54,auVar41);
            auVar47 = vsubps_avx512vl(auVar55,auVar44);
            auVar40 = vsubps_avx(auVar56,auVar88);
            auVar49 = vsubps_avx512vl(auVar60,auVar41);
            auVar45 = vsubps_avx512vl(auVar85,auVar44);
            auVar41 = vsubps_avx(auVar40,auVar39);
            auVar50 = vsubps_avx512vl(auVar49,auVar42);
            auVar44 = vsubps_avx(auVar45,auVar43);
            auVar51 = vsubps_avx512vl(auVar39,auVar48);
            auVar52 = vsubps_avx512vl(auVar42,auVar46);
            auVar53 = vsubps_avx512vl(auVar43,auVar47);
            auVar54 = vsubps_avx512vl(auVar48,auVar40);
            auVar55 = vsubps_avx512vl(auVar46,auVar49);
            auVar56 = vsubps_avx512vl(auVar47,auVar45);
            auVar66._0_4_ = auVar40._0_4_ + auVar39._0_4_;
            auVar66._4_4_ = auVar40._4_4_ + auVar39._4_4_;
            auVar66._8_4_ = auVar40._8_4_ + auVar39._8_4_;
            auVar66._12_4_ = auVar40._12_4_ + auVar39._12_4_;
            auVar66._16_4_ = auVar40._16_4_ + auVar39._16_4_;
            auVar66._20_4_ = auVar40._20_4_ + auVar39._20_4_;
            auVar66._24_4_ = auVar40._24_4_ + auVar39._24_4_;
            auVar66._28_4_ = auVar40._28_4_ + auVar39._28_4_;
            auVar57 = vaddps_avx512vl(auVar49,auVar42);
            auVar58 = vaddps_avx512vl(auVar45,auVar43);
            auVar59 = vmulps_avx512vl(auVar57,auVar44);
            auVar59 = vfmsub231ps_avx512vl(auVar59,auVar50,auVar58);
            auVar58 = vmulps_avx512vl(auVar58,auVar41);
            auVar60 = vfmsub231ps_avx512vl(auVar58,auVar44,auVar66);
            auVar58._4_4_ = auVar50._4_4_ * auVar66._4_4_;
            auVar58._0_4_ = auVar50._0_4_ * auVar66._0_4_;
            auVar58._8_4_ = auVar50._8_4_ * auVar66._8_4_;
            auVar58._12_4_ = auVar50._12_4_ * auVar66._12_4_;
            auVar58._16_4_ = auVar50._16_4_ * auVar66._16_4_;
            auVar58._20_4_ = auVar50._20_4_ * auVar66._20_4_;
            auVar58._24_4_ = auVar50._24_4_ * auVar66._24_4_;
            auVar58._28_4_ = auVar66._28_4_;
            auVar34 = vfmsub231ps_fma(auVar58,auVar41,auVar57);
            auVar67._0_4_ = fVar68 * auVar34._0_4_;
            auVar67._4_4_ = fVar68 * auVar34._4_4_;
            auVar67._8_4_ = fVar68 * auVar34._8_4_;
            auVar67._12_4_ = fVar68 * auVar34._12_4_;
            auVar67._16_4_ = fVar68 * 0.0;
            auVar67._20_4_ = fVar68 * 0.0;
            auVar67._24_4_ = fVar68 * 0.0;
            auVar67._28_4_ = 0;
            auVar58 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar60);
            local_2560 = vfmadd231ps_avx512vl(auVar58,auVar71,auVar59);
            auVar58 = vaddps_avx512vl(auVar39,auVar48);
            auVar57 = vaddps_avx512vl(auVar42,auVar46);
            auVar59 = vaddps_avx512vl(auVar43,auVar47);
            auVar60 = vmulps_avx512vl(auVar57,auVar53);
            auVar60 = vfmsub231ps_avx512vl(auVar60,auVar52,auVar59);
            auVar59 = vmulps_avx512vl(auVar59,auVar51);
            auVar59 = vfmsub231ps_avx512vl(auVar59,auVar53,auVar58);
            auVar58 = vmulps_avx512vl(auVar58,auVar52);
            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar51,auVar57);
            auVar57._4_4_ = fVar68 * auVar58._4_4_;
            auVar57._0_4_ = fVar68 * auVar58._0_4_;
            auVar57._8_4_ = fVar68 * auVar58._8_4_;
            auVar57._12_4_ = fVar68 * auVar58._12_4_;
            auVar57._16_4_ = fVar68 * auVar58._16_4_;
            auVar57._20_4_ = fVar68 * auVar58._20_4_;
            auVar57._24_4_ = fVar68 * auVar58._24_4_;
            auVar57._28_4_ = auVar58._28_4_;
            auVar58 = vfmadd231ps_avx512vl(auVar57,auVar72,auVar59);
            local_2540 = vfmadd231ps_avx512vl(auVar58,auVar71,auVar60);
            auVar40 = vaddps_avx512vl(auVar48,auVar40);
            auVar48 = vaddps_avx512vl(auVar46,auVar49);
            auVar58 = vaddps_avx512vl(auVar47,auVar45);
            auVar46 = vmulps_avx512vl(auVar48,auVar56);
            auVar46 = vfmsub231ps_avx512vl(auVar46,auVar55,auVar58);
            auVar45._4_4_ = auVar58._4_4_ * auVar54._4_4_;
            auVar45._0_4_ = auVar58._0_4_ * auVar54._0_4_;
            auVar45._8_4_ = auVar58._8_4_ * auVar54._8_4_;
            auVar45._12_4_ = auVar58._12_4_ * auVar54._12_4_;
            auVar45._16_4_ = auVar58._16_4_ * auVar54._16_4_;
            auVar45._20_4_ = auVar58._20_4_ * auVar54._20_4_;
            auVar45._24_4_ = auVar58._24_4_ * auVar54._24_4_;
            auVar45._28_4_ = auVar58._28_4_;
            auVar34 = vfmsub231ps_fma(auVar45,auVar56,auVar40);
            auVar59._4_4_ = auVar40._4_4_ * auVar55._4_4_;
            auVar59._0_4_ = auVar40._0_4_ * auVar55._0_4_;
            auVar59._8_4_ = auVar40._8_4_ * auVar55._8_4_;
            auVar59._12_4_ = auVar40._12_4_ * auVar55._12_4_;
            auVar59._16_4_ = auVar40._16_4_ * auVar55._16_4_;
            auVar59._20_4_ = auVar40._20_4_ * auVar55._20_4_;
            auVar59._24_4_ = auVar40._24_4_ * auVar55._24_4_;
            auVar59._28_4_ = auVar40._28_4_;
            auVar40 = vfmsub231ps_avx512vl(auVar59,auVar54,auVar48);
            auVar40 = vmulps_avx512vl(auVar75,auVar40);
            auVar40 = vfmadd231ps_avx512vl(auVar40,auVar72,ZEXT1632(auVar34));
            auVar40 = vfmadd231ps_avx512vl(auVar40,auVar71,auVar46);
            auVar86._0_4_ = local_2560._0_4_ + local_2540._0_4_;
            auVar86._4_4_ = local_2560._4_4_ + local_2540._4_4_;
            auVar86._8_4_ = local_2560._8_4_ + local_2540._8_4_;
            auVar86._12_4_ = local_2560._12_4_ + local_2540._12_4_;
            auVar86._16_4_ = local_2560._16_4_ + local_2540._16_4_;
            auVar86._20_4_ = local_2560._20_4_ + local_2540._20_4_;
            auVar86._24_4_ = local_2560._24_4_ + local_2540._24_4_;
            auVar86._28_4_ = local_2560._28_4_ + local_2540._28_4_;
            local_2520 = vaddps_avx512vl(auVar40,auVar86);
            auVar47 = auVar100._0_32_;
            vandps_avx512vl(local_2520,auVar47);
            auVar48._8_4_ = 0x34000000;
            auVar48._0_8_ = 0x3400000034000000;
            auVar48._12_4_ = 0x34000000;
            auVar48._16_4_ = 0x34000000;
            auVar48._20_4_ = 0x34000000;
            auVar48._24_4_ = 0x34000000;
            auVar48._28_4_ = 0x34000000;
            auVar48 = vmulps_avx512vl(local_2520,auVar48);
            auVar58 = vminps_avx512vl(local_2560,local_2540);
            auVar58 = vminps_avx512vl(auVar58,auVar40);
            auVar46 = vxorps_avx512vl(auVar48,auVar101._0_32_);
            uVar70 = vcmpps_avx512vl(auVar58,auVar46,5);
            auVar58 = vmaxps_avx512vl(local_2560,local_2540);
            auVar40 = vmaxps_avx512vl(auVar58,auVar40);
            uVar9 = vcmpps_avx512vl(auVar40,auVar48,2);
            local_24a0 = (byte)uVar70 | (byte)uVar9;
            if (local_24a0 != 0) {
              auVar40 = vmulps_avx512vl(auVar44,auVar52);
              auVar48 = vmulps_avx512vl(auVar41,auVar53);
              auVar58 = vmulps_avx512vl(auVar50,auVar51);
              auVar46 = vmulps_avx512vl(auVar53,auVar55);
              auVar49 = vmulps_avx512vl(auVar51,auVar56);
              auVar57 = vmulps_avx512vl(auVar52,auVar54);
              auVar45 = vfmsub213ps_avx512vl(auVar50,auVar53,auVar40);
              auVar44 = vfmsub213ps_avx512vl(auVar44,auVar51,auVar48);
              auVar41 = vfmsub213ps_avx512vl(auVar41,auVar52,auVar58);
              auVar59 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar46);
              auVar50 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar49);
              auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar57);
              vandps_avx512vl(auVar40,auVar47);
              vandps_avx512vl(auVar46,auVar47);
              uVar29 = vcmpps_avx512vl(auVar51,auVar51,1);
              vandps_avx512vl(auVar48,auVar47);
              vandps_avx512vl(auVar49,auVar47);
              uVar10 = vcmpps_avx512vl(auVar51,auVar51,1);
              vandps_avx512vl(auVar58,auVar47);
              vandps_avx512vl(auVar57,auVar47);
              uVar11 = vcmpps_avx512vl(auVar51,auVar51,1);
              bVar6 = (bool)((byte)uVar29 & 1);
              local_2500._0_4_ = (float)((uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar59._0_4_)
              ;
              bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
              local_2500._4_4_ = (float)((uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar59._4_4_)
              ;
              bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
              local_2500._8_4_ = (float)((uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar59._8_4_)
              ;
              bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar59._12_4_);
              bVar6 = (bool)((byte)(uVar29 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * auVar59._16_4_);
              bVar6 = (bool)((byte)(uVar29 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar6 * auVar45._20_4_ | (uint)!bVar6 * auVar59._20_4_);
              bVar6 = (bool)((byte)(uVar29 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar6 * auVar45._24_4_ | (uint)!bVar6 * auVar59._24_4_);
              bVar6 = SUB81(uVar29 >> 7,0);
              local_2500._28_4_ = (uint)bVar6 * auVar45._28_4_ | (uint)!bVar6 * auVar59._28_4_;
              bVar6 = (bool)((byte)uVar10 & 1);
              local_24e0._0_4_ = (float)((uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * auVar50._0_4_)
              ;
              bVar6 = (bool)((byte)(uVar10 >> 1) & 1);
              local_24e0._4_4_ = (float)((uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar50._4_4_)
              ;
              bVar6 = (bool)((byte)(uVar10 >> 2) & 1);
              local_24e0._8_4_ = (float)((uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar50._8_4_)
              ;
              bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar50._12_4_);
              bVar6 = (bool)((byte)(uVar10 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar6 * auVar44._16_4_ | (uint)!bVar6 * auVar50._16_4_);
              bVar6 = (bool)((byte)(uVar10 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar6 * auVar44._20_4_ | (uint)!bVar6 * auVar50._20_4_);
              bVar6 = (bool)((byte)(uVar10 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar6 * auVar44._24_4_ | (uint)!bVar6 * auVar50._24_4_);
              bVar6 = SUB81(uVar10 >> 7,0);
              local_24e0._28_4_ = (uint)bVar6 * auVar44._28_4_ | (uint)!bVar6 * auVar50._28_4_;
              bVar6 = (bool)((byte)uVar11 & 1);
              local_24c0 = (float)((uint)bVar6 * auVar41._0_4_ | (uint)!bVar6 * auVar51._0_4_);
              bVar6 = (bool)((byte)(uVar11 >> 1) & 1);
              fStack_24bc = (float)((uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * auVar51._4_4_);
              bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
              fStack_24b8 = (float)((uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * auVar51._8_4_);
              bVar6 = (bool)((byte)(uVar11 >> 3) & 1);
              fStack_24b4 = (float)((uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * auVar51._12_4_);
              bVar6 = (bool)((byte)(uVar11 >> 4) & 1);
              fStack_24b0 = (float)((uint)bVar6 * auVar41._16_4_ | (uint)!bVar6 * auVar51._16_4_);
              bVar6 = (bool)((byte)(uVar11 >> 5) & 1);
              fStack_24ac = (float)((uint)bVar6 * auVar41._20_4_ | (uint)!bVar6 * auVar51._20_4_);
              bVar6 = (bool)((byte)(uVar11 >> 6) & 1);
              fStack_24a8 = (float)((uint)bVar6 * auVar41._24_4_ | (uint)!bVar6 * auVar51._24_4_);
              bVar6 = SUB81(uVar11 >> 7,0);
              uStack_24a4 = (uint)bVar6 * auVar41._28_4_ | (uint)!bVar6 * auVar51._28_4_;
              auVar18._4_4_ = fVar68 * fStack_24bc;
              auVar18._0_4_ = fVar68 * local_24c0;
              auVar18._8_4_ = fVar68 * fStack_24b8;
              auVar18._12_4_ = fVar68 * fStack_24b4;
              auVar18._16_4_ = fVar68 * fStack_24b0;
              auVar18._20_4_ = fVar68 * fStack_24ac;
              auVar18._24_4_ = fVar68 * fStack_24a8;
              auVar18._28_4_ = fVar68;
              auVar34 = vfmadd213ps_fma(auVar72,local_24e0,auVar18);
              auVar34 = vfmadd213ps_fma(auVar71,local_2500,ZEXT1632(auVar34));
              auVar41 = ZEXT1632(CONCAT412(auVar34._12_4_ + auVar34._12_4_,
                                           CONCAT48(auVar34._8_4_ + auVar34._8_4_,
                                                    CONCAT44(auVar34._4_4_ + auVar34._4_4_,
                                                             auVar34._0_4_ + auVar34._0_4_))));
              auVar73._0_4_ = auVar43._0_4_ * local_24c0;
              auVar73._4_4_ = auVar43._4_4_ * fStack_24bc;
              auVar73._8_4_ = auVar43._8_4_ * fStack_24b8;
              auVar73._12_4_ = auVar43._12_4_ * fStack_24b4;
              auVar73._16_4_ = auVar43._16_4_ * fStack_24b0;
              auVar73._20_4_ = auVar43._20_4_ * fStack_24ac;
              auVar73._24_4_ = auVar43._24_4_ * fStack_24a8;
              auVar73._28_4_ = 0;
              auVar34 = vfmadd213ps_fma(auVar42,local_24e0,auVar73);
              auVar7 = vfmadd213ps_fma(auVar39,local_2500,ZEXT1632(auVar34));
              auVar39 = vrcp14ps_avx512vl(auVar41);
              auVar44 = auVar102._0_32_;
              auVar40 = vfnmadd213ps_avx512vl(auVar39,auVar41,auVar44);
              auVar34 = vfmadd132ps_fma(auVar40,auVar39,auVar39);
              local_2720 = ZEXT1632(CONCAT412(auVar34._12_4_ * (auVar7._12_4_ + auVar7._12_4_),
                                              CONCAT48(auVar34._8_4_ * (auVar7._8_4_ + auVar7._8_4_)
                                                       ,CONCAT44(auVar34._4_4_ *
                                                                 (auVar7._4_4_ + auVar7._4_4_),
                                                                 auVar34._0_4_ *
                                                                 (auVar7._0_4_ + auVar7._0_4_)))));
              uVar65 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar14._4_4_ = uVar65;
              auVar14._0_4_ = uVar65;
              auVar14._8_4_ = uVar65;
              auVar14._12_4_ = uVar65;
              auVar14._16_4_ = uVar65;
              auVar14._20_4_ = uVar65;
              auVar14._24_4_ = uVar65;
              auVar14._28_4_ = uVar65;
              uVar70 = vcmpps_avx512vl(local_2720,auVar14,0xd);
              auVar39 = vxorps_avx512vl(auVar41,auVar101._0_32_);
              fVar68 = (ray->super_RayK<1>).tfar;
              auVar15._4_4_ = fVar68;
              auVar15._0_4_ = fVar68;
              auVar15._8_4_ = fVar68;
              auVar15._12_4_ = fVar68;
              auVar15._16_4_ = fVar68;
              auVar15._20_4_ = fVar68;
              auVar15._24_4_ = fVar68;
              auVar15._28_4_ = fVar68;
              uVar9 = vcmpps_avx512vl(local_2720,auVar15,2);
              uVar12 = vcmpps_avx512vl(auVar41,auVar39,4);
              local_24a0 = (byte)uVar70 & (byte)uVar9 & (byte)uVar12 & local_24a0;
              uVar33 = (uint)local_24a0;
              if (local_24a0 != 0) {
                local_2700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar26 = vextractps_avx(local_2700._0_16_,1);
                local_2440 = local_2720;
                local_23c0 = 0xf0;
                pSVar3 = context->scene;
                auVar16._8_4_ = 0x219392ef;
                auVar16._0_8_ = 0x219392ef219392ef;
                auVar16._12_4_ = 0x219392ef;
                auVar16._16_4_ = 0x219392ef;
                auVar16._20_4_ = 0x219392ef;
                auVar16._24_4_ = 0x219392ef;
                auVar16._28_4_ = 0x219392ef;
                uVar29 = vcmpps_avx512vl(local_2520,auVar16,5);
                auVar39 = vrcp14ps_avx512vl(local_2520);
                auVar40 = vfnmadd213ps_avx512vl(local_2520,auVar39,auVar44);
                auVar40 = vfmadd132ps_avx512vl(auVar40,auVar39,auVar39);
                fVar78 = (float)((uint)((byte)uVar29 & 1) * auVar40._0_4_);
                fVar68 = (float)((uint)((byte)(uVar29 >> 1) & 1) * auVar40._4_4_);
                fVar83 = (float)((uint)((byte)(uVar29 >> 2) & 1) * auVar40._8_4_);
                fVar82 = (float)((uint)((byte)(uVar29 >> 3) & 1) * auVar40._12_4_);
                fVar81 = (float)((uint)((byte)(uVar29 >> 4) & 1) * auVar40._16_4_);
                fVar80 = (float)((uint)((byte)(uVar29 >> 5) & 1) * auVar40._20_4_);
                fVar79 = (float)((uint)((byte)(uVar29 >> 6) & 1) * auVar40._24_4_);
                auVar19._4_4_ = fVar68 * local_2560._4_4_;
                auVar19._0_4_ = fVar78 * local_2560._0_4_;
                auVar19._8_4_ = fVar83 * local_2560._8_4_;
                auVar19._12_4_ = fVar82 * local_2560._12_4_;
                auVar19._16_4_ = fVar81 * local_2560._16_4_;
                auVar19._20_4_ = fVar80 * local_2560._20_4_;
                auVar19._24_4_ = fVar79 * local_2560._24_4_;
                auVar19._28_4_ = local_2560._28_4_;
                auVar40 = vminps_avx512vl(auVar19,auVar44);
                auVar20._4_4_ = fVar68 * local_2540._4_4_;
                auVar20._0_4_ = fVar78 * local_2540._0_4_;
                auVar20._8_4_ = fVar83 * local_2540._8_4_;
                auVar20._12_4_ = fVar82 * local_2540._12_4_;
                auVar20._16_4_ = fVar81 * local_2540._16_4_;
                auVar20._20_4_ = fVar80 * local_2540._20_4_;
                auVar20._24_4_ = fVar79 * local_2540._24_4_;
                auVar20._28_4_ = auVar39._28_4_;
                auVar39 = vminps_avx512vl(auVar20,auVar44);
                auVar41 = vsubps_avx512vl(auVar44,auVar40);
                auVar44 = vsubps_avx512vl(auVar44,auVar39);
                local_2460 = vblendps_avx(auVar39,auVar41,0xf0);
                local_2480 = vblendps_avx(auVar40,auVar44,0xf0);
                fVar68 = (float)DAT_01fef940;
                fVar78 = DAT_01fef940._4_4_;
                fVar79 = DAT_01fef940._8_4_;
                fVar80 = DAT_01fef940._12_4_;
                fVar81 = DAT_01fef940._16_4_;
                fVar82 = DAT_01fef940._20_4_;
                fVar83 = DAT_01fef940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar68;
                local_2420[1] = local_2500._4_4_ * fVar78;
                local_2420[2] = local_2500._8_4_ * fVar79;
                local_2420[3] = local_2500._12_4_ * fVar80;
                fStack_2410 = local_2500._16_4_ * fVar81;
                fStack_240c = local_2500._20_4_ * fVar82;
                fStack_2408 = local_2500._24_4_ * fVar83;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar68;
                local_2400[1] = local_24e0._4_4_ * fVar78;
                local_2400[2] = local_24e0._8_4_ * fVar79;
                local_2400[3] = local_24e0._12_4_ * fVar80;
                fStack_23f0 = local_24e0._16_4_ * fVar81;
                fStack_23ec = local_24e0._20_4_ * fVar82;
                fStack_23e8 = local_24e0._24_4_ * fVar83;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar68;
                local_23e0[1] = fStack_24bc * fVar78;
                local_23e0[2] = fStack_24b8 * fVar79;
                local_23e0[3] = fStack_24b4 * fVar80;
                fStack_23d0 = fStack_24b0 * fVar81;
                fStack_23cc = fStack_24ac * fVar82;
                fStack_23c8 = fStack_24a8 * fVar83;
                uStack_23c4 = uStack_24a4;
                auVar63._8_4_ = 0x7f800000;
                auVar63._0_8_ = 0x7f8000007f800000;
                auVar63._12_4_ = 0x7f800000;
                auVar63._16_4_ = 0x7f800000;
                auVar63._20_4_ = 0x7f800000;
                auVar63._24_4_ = 0x7f800000;
                auVar63._28_4_ = 0x7f800000;
                auVar39 = vblendmps_avx512vl(auVar63,local_2720);
                auVar61._0_4_ =
                     (uint)(local_24a0 & 1) * auVar39._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 1 & 1);
                auVar61._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 2 & 1);
                auVar61._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 3 & 1);
                auVar61._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 4 & 1);
                auVar61._16_4_ = (uint)bVar6 * auVar39._16_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 5 & 1);
                auVar61._20_4_ = (uint)bVar6 * auVar39._20_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(local_24a0 >> 6 & 1);
                auVar61._24_4_ = (uint)bVar6 * auVar39._24_4_ | (uint)!bVar6 * 0x7f800000;
                auVar61._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar39._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar39 = vshufps_avx(auVar61,auVar61,0xb1);
                auVar39 = vminps_avx(auVar61,auVar39);
                auVar40 = vshufpd_avx(auVar39,auVar39,5);
                auVar39 = vminps_avx(auVar39,auVar40);
                auVar40 = vpermpd_avx2(auVar39,0x4e);
                auVar39 = vminps_avx(auVar39,auVar40);
                uVar70 = vcmpps_avx512vl(auVar61,auVar39,0);
                uVar25 = uVar33;
                if (((byte)uVar70 & local_24a0) != 0) {
                  uVar25 = (uint)((byte)uVar70 & local_24a0);
                }
                bVar21 = 0;
                for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
                  bVar21 = bVar21 + 1;
                }
                do {
                  uVar25 = *(uint *)((long)&local_2580 + (ulong)bVar21 * 4);
                  pGVar4 = (pSVar3->geometries).items[uVar25].ptr;
                  if ((pGVar4->mask & uVar26) == 0) {
                    uVar33 = (uint)(byte)(~(byte)(1 << (bVar21 & 0x1f)) & (byte)uVar33);
                  }
                  else {
                    pRVar5 = context->args;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      pRVar27 = context->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar29 = (ulong)bVar21;
                        lVar22 = uVar29 * 4;
                        fVar68 = *(float *)(local_2480 + lVar22);
                        fVar78 = *(float *)(local_2460 + lVar22);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2440 + lVar22);
                        (ray->Ng).field_0.field_0.x = local_2420[uVar29];
                        (ray->Ng).field_0.field_0.y = local_2400[uVar29];
                        (ray->Ng).field_0.field_0.z = local_23e0[uVar29];
                        ray->u = fVar68;
                        ray->v = fVar78;
                        ray->primID = *(uint *)((long)&local_26e0 + lVar22);
                        ray->geomID = uVar25;
                        ray->instID[0] = pRVar27->instID[0];
                        ray->instPrimID[0] = pRVar27->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar27 = context->user;
                    }
                    uVar29 = (ulong)((uint)bVar21 * 4);
                    local_2750 = *(float *)((long)local_2420 + uVar29);
                    local_274c = *(undefined4 *)((long)local_2400 + uVar29);
                    local_2748 = *(undefined4 *)((long)local_23e0 + uVar29);
                    local_2744 = *(undefined4 *)(local_2480 + uVar29);
                    local_2740 = *(undefined4 *)(local_2460 + uVar29);
                    local_273c = *(undefined4 *)((long)&local_26e0 + uVar29);
                    local_2738 = uVar25;
                    local_2734 = pRVar27->instID[0];
                    local_2730 = pRVar27->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar29);
                    local_278c = -1;
                    local_2788.valid = &local_278c;
                    local_2788.geometryUserPtr = pGVar4->userPtr;
                    local_2788.context = pRVar27;
                    local_2788.ray = (RTCRayN *)ray;
                    local_2788.hit = (RTCHitN *)&local_2750;
                    local_2788.N = 1;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f2695a:
                      if ((pRVar5->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar5->filter)(&local_2788);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar102 = ZEXT3264(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar101 = ZEXT3264(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar100 = ZEXT3264(auVar39);
                        if (*local_2788.valid == 0) goto LAB_01f26a27;
                      }
                      (((Vec3f *)((long)local_2788.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2788.hit;
                      (((Vec3f *)((long)local_2788.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2788.hit + 4);
                      (((Vec3f *)((long)local_2788.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2788.hit + 8);
                      *(float *)((long)local_2788.ray + 0x3c) = *(float *)(local_2788.hit + 0xc);
                      *(float *)((long)local_2788.ray + 0x40) = *(float *)(local_2788.hit + 0x10);
                      *(float *)((long)local_2788.ray + 0x44) = *(float *)(local_2788.hit + 0x14);
                      *(float *)((long)local_2788.ray + 0x48) = *(float *)(local_2788.hit + 0x18);
                      *(float *)((long)local_2788.ray + 0x4c) = *(float *)(local_2788.hit + 0x1c);
                      *(float *)((long)local_2788.ray + 0x50) = *(float *)(local_2788.hit + 0x20);
                    }
                    else {
                      (*pGVar4->intersectionFilterN)(&local_2788);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar102 = ZEXT3264(auVar39);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar101 = ZEXT3264(auVar39);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar100 = ZEXT3264(auVar39);
                      if (*local_2788.valid != 0) goto LAB_01f2695a;
LAB_01f26a27:
                      (ray->super_RayK<1>).tfar = (float)local_2700._0_4_;
                    }
                    fVar68 = (ray->super_RayK<1>).tfar;
                    auVar17._4_4_ = fVar68;
                    auVar17._0_4_ = fVar68;
                    auVar17._8_4_ = fVar68;
                    auVar17._12_4_ = fVar68;
                    auVar17._16_4_ = fVar68;
                    auVar17._20_4_ = fVar68;
                    auVar17._24_4_ = fVar68;
                    auVar17._28_4_ = fVar68;
                    uVar70 = vcmpps_avx512vl(local_2720,auVar17,2);
                    uVar33 = (uint)(byte)(~(byte)(1 << (bVar21 & 0x1f)) & (byte)uVar33) &
                             (uint)uVar70;
                    uVar26 = (ray->super_RayK<1>).mask;
                    local_2700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  }
                  if ((char)uVar33 == '\0') break;
                  BVHNIntersector1<8,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,true>>>
                  ::intersect();
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar102 = ZEXT3264(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar101 = ZEXT3264(auVar39);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar100 = ZEXT3264(auVar39);
                  bVar21 = (byte)local_2788.valid;
                } while( true );
              }
            }
            local_2798 = local_2798 + 1;
          } while (local_2798 != local_2758);
        }
        fVar68 = (ray->super_RayK<1>).tfar;
        auVar64 = ZEXT3264(CONCAT428(fVar68,CONCAT424(fVar68,CONCAT420(fVar68,CONCAT416(fVar68,
                                                  CONCAT412(fVar68,CONCAT48(fVar68,CONCAT44(fVar68,
                                                  fVar68))))))));
        auVar74 = ZEXT3264(local_25a0);
        auVar76 = ZEXT3264(local_25c0);
        auVar77 = ZEXT3264(local_25e0);
        auVar84 = ZEXT3264(local_2620);
        auVar87 = ZEXT3264(local_2640);
        auVar95 = ZEXT3264(local_2680);
        auVar96 = ZEXT3264(local_26a0);
        auVar97 = ZEXT3264(local_26c0);
        auVar98 = ZEXT3264(_DAT_01fe9900);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
        auVar99 = ZEXT3264(auVar39);
        fVar68 = local_2600;
        fVar78 = fStack_25fc;
        fVar79 = fStack_25f8;
        fVar80 = fStack_25f4;
        fVar81 = fStack_25f0;
        fVar82 = fStack_25ec;
        fVar83 = fStack_25e8;
        fVar62 = local_2660;
        fVar89 = fStack_265c;
        fVar90 = fStack_2658;
        fVar91 = fStack_2654;
        fVar92 = fStack_2650;
        fVar93 = fStack_264c;
        fVar94 = fStack_2648;
      }
LAB_01f26b8d:
    } while (local_27e8 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }